

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Operation<duckdb::date_t,long,duckdb::ArgMinMaxState<duckdb::date_t,long>,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
               (ArgMinMaxState<duckdb::date_t,_long> *state,date_t *x,long *y,
               AggregateBinaryInput *binary)

{
  bool bVar1;
  
  if ((state->super_ArgMinMaxStateBase).is_initialized != false) {
    Execute<duckdb::date_t,long,duckdb::ArgMinMaxState<duckdb::date_t,long>>
              (state,(date_t)x->days,*y,binary);
    return;
  }
  bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                    (&binary->right_mask->super_TemplatedValidityMask<unsigned_long>,binary->ridx);
  if (bVar1) {
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&binary->left_mask->super_TemplatedValidityMask<unsigned_long>,binary->lidx);
    (state->super_ArgMinMaxStateBase).arg_null = !bVar1;
    if (bVar1) {
      (state->arg).days = x->days;
    }
    state->value = *y;
    (state->super_ArgMinMaxStateBase).is_initialized = true;
  }
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}